

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDenseNetwork.cpp
# Opt level: O3

string * __thiscall
IDenseNetwork::GetStringStats_abi_cxx11_(string *__return_storage_ptr__,IDenseNetwork *this)

{
  pointer ppIVar1;
  ostream *poVar2;
  pointer ppIVar3;
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  ppIVar3 = (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar1 = (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar3 != ppIVar1) {
    do {
      poVar2 = operator<<(local_1a0,*ppIVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      ppIVar3 = ppIVar3 + 1;
    } while (ppIVar3 != ppIVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string IDenseNetwork::GetStringStats() const
{
    std::stringstream ss;
    for ( ILayer *layer: layers ) {
        ss << *layer << "\n";
    }
    return ss.str();
}